

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::sampleTextureNonProjected
               (SurfaceAccess *dst,Texture2DArrayView *rawSrc,Vec4 *sq,Vec4 *tq,Vec4 *rq,
               ReferenceParams *params)

{
  float fVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  float fVar5;
  Texture2DArrayView TVar6;
  float local_1a0;
  float local_19c;
  float local_154;
  Vector<float,_4> local_13c;
  Vector<float,_4> local_12c;
  Vec4 local_11c;
  float local_10c;
  float local_108;
  float lod;
  float r;
  float t;
  float s;
  float triY;
  float triX;
  int triNdx;
  float xf;
  float yf;
  int x;
  int y;
  float triLod [2];
  Vec3 triR [2];
  undefined1 local_b8 [8];
  Vec3 triT [2];
  undefined1 local_98 [8];
  Vec3 triS [2];
  IVec2 srcSize;
  IVec2 dstSize;
  float lodBias;
  undefined1 local_60 [8];
  Texture2DArrayView src;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  ReferenceParams *params_local;
  Vec4 *rq_local;
  Vec4 *tq_local;
  Vec4 *sq_local;
  Texture2DArrayView *rawSrc_local;
  SurfaceAccess *dst_local;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  TVar6 = tcu::getEffectiveTextureView
                    (rawSrc,(vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             *)&src.m_levels,&params->sampler);
  src._0_8_ = TVar6.m_levels;
  local_60._0_4_ = TVar6.m_numLevels;
  if (((params->super_RenderParams).flags & 2) == 0) {
    local_154 = 0.0;
  }
  else {
    local_154 = (params->super_RenderParams).bias;
  }
  iVar2 = tcu::SurfaceAccess::getWidth(dst);
  iVar3 = tcu::SurfaceAccess::getHeight(dst);
  tcu::Vector<int,_2>::Vector(&srcSize,iVar2,iVar3);
  iVar2 = tcu::Texture2DArrayView::getWidth((Texture2DArrayView *)local_60);
  iVar3 = tcu::Texture2DArrayView::getHeight((Texture2DArrayView *)local_60);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)(triS[1].m_data + 1),iVar2,iVar3);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_98,(int)sq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triS[0].m_data + 1),(int)sq,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_b8,(int)tq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triT[0].m_data + 1),(int)tq,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)triLod,(int)rq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triR[0].m_data + 1),(int)rq,3,2);
  fVar5 = computeNonProjectedTriLod
                    (params->lodMode,&srcSize,(IVec2 *)(triS[1].m_data + 1),(Vec3 *)local_98,
                     (Vec3 *)local_b8);
  x = (int)de::clamp<float>(fVar5 + local_154,params->minLod,params->maxLod);
  fVar5 = computeNonProjectedTriLod
                    (params->lodMode,&srcSize,(IVec2 *)(triS[1].m_data + 1),
                     (Vec3 *)(triS[0].m_data + 1),(Vec3 *)(triT[0].m_data + 1));
  y = (int)de::clamp<float>(fVar5 + local_154,params->minLod,params->maxLod);
  for (yf = 0.0; fVar5 = yf, iVar2 = tcu::SurfaceAccess::getHeight(dst), (int)fVar5 < iVar2;
      yf = (float)((int)yf + 1)) {
    for (xf = 0.0; fVar5 = xf, iVar2 = tcu::SurfaceAccess::getWidth(dst), (int)fVar5 < iVar2;
        xf = (float)((int)xf + 1)) {
      fVar5 = (float)(int)yf;
      iVar2 = tcu::SurfaceAccess::getHeight(dst);
      triNdx = (int)((fVar5 + 0.5) / (float)iVar2);
      fVar5 = (float)(int)xf;
      iVar2 = tcu::SurfaceAccess::getWidth(dst);
      triX = (fVar5 + 0.5) / (float)iVar2;
      triY = (float)(uint)(1.0 <= triX + (float)triNdx);
      local_19c = triX;
      if (triY != 0.0) {
        local_19c = 1.0 - triX;
      }
      s = local_19c;
      if (triY == 0.0) {
        local_1a0 = (float)triNdx;
      }
      else {
        local_1a0 = 1.0 - (float)triNdx;
      }
      t = local_1a0;
      pfVar4 = tcu::Vector<float,_3>::x((Vector<float,_3> *)(triS[(long)(int)triY + -1].m_data + 1))
      ;
      fVar5 = *pfVar4;
      pfVar4 = tcu::Vector<float,_3>::y((Vector<float,_3> *)(triS[(long)(int)triY + -1].m_data + 1))
      ;
      fVar1 = *pfVar4;
      pfVar4 = tcu::Vector<float,_3>::z((Vector<float,_3> *)(triS[(long)(int)triY + -1].m_data + 1))
      ;
      r = triangleInterpolate(fVar5,fVar1,*pfVar4,s,t);
      pfVar4 = tcu::Vector<float,_3>::x((Vector<float,_3> *)(triT[(long)(int)triY + -1].m_data + 1))
      ;
      fVar5 = *pfVar4;
      pfVar4 = tcu::Vector<float,_3>::y((Vector<float,_3> *)(triT[(long)(int)triY + -1].m_data + 1))
      ;
      fVar1 = *pfVar4;
      pfVar4 = tcu::Vector<float,_3>::z((Vector<float,_3> *)(triT[(long)(int)triY + -1].m_data + 1))
      ;
      lod = triangleInterpolate(fVar5,fVar1,*pfVar4,s,t);
      pfVar4 = tcu::Vector<float,_3>::x((Vector<float,_3> *)(triR[(long)(int)triY + -1].m_data + 1))
      ;
      fVar5 = *pfVar4;
      pfVar4 = tcu::Vector<float,_3>::y((Vector<float,_3> *)(triR[(long)(int)triY + -1].m_data + 1))
      ;
      fVar1 = *pfVar4;
      pfVar4 = tcu::Vector<float,_3>::z((Vector<float,_3> *)(triR[(long)(int)triY + -1].m_data + 1))
      ;
      local_108 = triangleInterpolate(fVar5,fVar1,*pfVar4,s,t);
      local_10c = (float)(&x)[(int)triY];
      execSample((TextureTestUtil *)&local_13c,(Texture2DArrayView *)local_60,params,r,lod,local_108
                 ,local_10c);
      tcu::operator*((tcu *)&local_12c,&local_13c,&(params->super_RenderParams).colorScale);
      tcu::operator+((tcu *)&local_11c,&local_12c,&(params->super_RenderParams).colorBias);
      tcu::SurfaceAccess::setPixel(dst,&local_11c,(int)xf,(int)yf);
    }
  }
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::~vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  return;
}

Assistant:

static void sampleTextureNonProjected (const tcu::SurfaceAccess& dst, const tcu::Texture2DArrayView& rawSrc, const tcu::Vec4& sq, const tcu::Vec4& tq, const tcu::Vec4& rq, const ReferenceParams& params)
{
	// Separate combined DS formats
	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture2DArrayView				src					= getEffectiveTextureView(rawSrc, srcLevelStorage, params.sampler);

	float										lodBias				= (params.flags & ReferenceParams::USE_BIAS) ? params.bias : 0.0f;

	tcu::IVec2									dstSize				= tcu::IVec2(dst.getWidth(), dst.getHeight());
	tcu::IVec2									srcSize				= tcu::IVec2(src.getWidth(), src.getHeight());

	// Coordinates and lod per triangle.
	tcu::Vec3									triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	tcu::Vec3									triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	tcu::Vec3									triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	float										triLod[2]			= { de::clamp(computeNonProjectedTriLod(params.lodMode, dstSize, srcSize, triS[0], triT[0]) + lodBias, params.minLod, params.maxLod),
																		de::clamp(computeNonProjectedTriLod(params.lodMode, dstSize, srcSize, triS[1], triT[1]) + lodBias, params.minLod, params.maxLod) };

	for (int y = 0; y < dst.getHeight(); y++)
	{
		for (int x = 0; x < dst.getWidth(); x++)
		{
			float	yf		= ((float)y + 0.5f) / (float)dst.getHeight();
			float	xf		= ((float)x + 0.5f) / (float)dst.getWidth();

			int		triNdx	= xf + yf >= 1.0f ? 1 : 0; // Top left fill rule.
			float	triX	= triNdx ? 1.0f-xf : xf;
			float	triY	= triNdx ? 1.0f-yf : yf;

			float	s		= triangleInterpolate(triS[triNdx].x(), triS[triNdx].y(), triS[triNdx].z(), triX, triY);
			float	t		= triangleInterpolate(triT[triNdx].x(), triT[triNdx].y(), triT[triNdx].z(), triX, triY);
			float	r		= triangleInterpolate(triR[triNdx].x(), triR[triNdx].y(), triR[triNdx].z(), triX, triY);
			float	lod		= triLod[triNdx];

			dst.setPixel(execSample(src, params, s, t, r, lod) * params.colorScale + params.colorBias, x, y);
		}
	}
}